

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::set
          (MutableCodePointTrie *this,UChar32 c,uint32_t value,UErrorCode *errorCode)

{
  bool bVar1;
  int32_t iVar2;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if ((uint)c < 0x110000) {
    bVar1 = ensureHighStart(this,c);
    if ((bVar1) && (iVar2 = getDataBlock(this,(uint)c >> 4), -1 < iVar2)) {
      this->data[iVar2 + (c & 0xfU)] = value;
      return;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }